

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O3

void __thiscall
SpikesConsumer_python::SpikesConsumer_python
          (SpikesConsumer_python *this,HighFreqDataType *hf,int ringbufsize,HFParsingInfo *parseargs
          ,int np)

{
  spikePacket *psVar1;
  dtype local_110;
  tuple_base local_108;
  int local_fc;
  HFParsingInfo local_f8;
  HighFreqDataType local_b8;
  
  HighFreqDataType::HighFreqDataType(&local_b8,hf);
  std::vector<int,_std::allocator<int>_>::vector(&local_f8.indices,&parseargs->indices);
  local_f8.sizeOf = parseargs->sizeOf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8.dataRequested,&parseargs->dataRequested);
  local_f8.dataLength = parseargs->dataLength;
  SpikesConsumer::SpikesConsumer(&this->super_SpikesConsumer,&local_b8,ringbufsize,&local_f8,np);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8.dataRequested);
  if (local_f8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_f8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  HighFreqDataType::~HighFreqDataType(&local_b8);
  (this->super_wrapper<SpikesConsumer>).super_wrapper_base.m_self = (PyObject *)0x0;
  (this->super_SpikesConsumer).super_HFSubConsumer.super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__SpikesConsumer_python_003ec2f0;
  psVar1 = (spikePacket *)operator_new(0x28);
  (psVar1->points).super__Vector_base<int2d,_std::allocator<int2d>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (psVar1->points).super__Vector_base<int2d,_std::allocator<int2d>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (psVar1->points).super__Vector_base<int2d,_std::allocator<int2d>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->data = psVar1;
  local_fc = 1;
  boost::python::make_tuple<int>((python *)&local_108,&local_fc);
  boost::python::numpy::detail::get_int_dtype<16,false>((detail *)&local_110);
  boost::python::numpy::empty((numpy *)&this->spikearray,(tuple *)&local_108,&local_110);
  *(long *)local_110.super_object.super_object_base.m_ptr =
       *(long *)local_110.super_object.super_object_base.m_ptr + -1;
  if (*(long *)local_110.super_object.super_object_base.m_ptr == 0) {
    _Py_Dealloc();
  }
  *(long *)local_108.super_object.super_object_base.m_ptr =
       *(long *)local_108.super_object.super_object_base.m_ptr + -1;
  if (*(long *)local_108.super_object.super_object_base.m_ptr == 0) {
    _Py_Dealloc();
  }
  psVar1 = this->data;
  psVar1->ntrodeid = 0;
  psVar1->cluster = 0;
  psVar1->timestamp = 0;
  std::vector<int2d,_std::allocator<int2d>_>::reserve(&psVar1->points,(long)np);
  return;
}

Assistant:

SpikesConsumer_python(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs, int np)
        : SpikesConsumer(hf, ringbufsize, parseargs, np),
          data(new spikePacket),
          spikearray(np::empty(boost::python::make_tuple(1), np::dtype::get_builtin<int16_t>()))
    {
        data->ntrodeid=0;
        data->cluster=0;
        data->timestamp=0;
        data->points.reserve(np);
    }